

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O0

void __thiscall wasm::ModuleWriter::writeBinary(ModuleWriter *this,Module *wasm,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_330 [8];
  Output output;
  string *filename_local;
  Module *wasm_local;
  ModuleWriter *this_local;
  
  output._776_8_ = filename;
  bVar1 = isDebugEnabled("writer");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"writing binary to ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,"\n");
  }
  Output::Output((Output *)local_330,filename,Binary);
  writeBinary(this,wasm,(Output *)local_330);
  Output::~Output((Output *)local_330);
  return;
}

Assistant:

void ModuleWriter::writeBinary(Module& wasm, std::string filename) {
  BYN_TRACE("writing binary to " << filename << "\n");
  Output output(filename, Flags::Binary);
  writeBinary(wasm, output);
}